

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::SnapEdge(S2Builder *this,InputEdgeId e,vector<int,_std::allocator<int>_> *chain)

{
  S2Point *a1;
  pointer pVVar1;
  int *piVar2;
  S2Point *x0;
  int iVar3;
  Excluded EVar4;
  int iVar5;
  pointer piVar6;
  ostream *poVar7;
  uint uVar8;
  iterator iVar9;
  pointer pcVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar15;
  pointer ppVar16;
  S2Point *x;
  ulong uVar17;
  SiteId site_id;
  S2Point b;
  S1ChordAngle ac;
  S1ChordAngle bc;
  S2Point a;
  int local_b4;
  S2Point *local_b0;
  S2Point local_a8;
  vector<int,std::allocator<int>> *local_88;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_80;
  long local_78;
  pointer local_70;
  pointer local_68;
  int *local_60;
  S1ChordAngle local_58;
  S1ChordAngle local_50;
  S2Point local_48;
  
  piVar6 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar9._M_current =
       (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar9._M_current != piVar6) {
    (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar6;
    iVar9._M_current = piVar6;
  }
  lVar12 = (long)e;
  ppVar16 = (this->input_edges_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start + lVar12;
  if (this->snapping_needed_ == false) {
    piVar6 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    if (iVar9._M_current == piVar6) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)chain,iVar9,&ppVar16->first);
      iVar9._M_current =
           (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar6 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar9._M_current = ppVar16->first;
      iVar9._M_current = iVar9._M_current + 1;
      (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar9._M_current;
    }
    if (iVar9._M_current == piVar6) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)chain,iVar9,&ppVar16->second);
      return;
    }
    *iVar9._M_current = ppVar16->second;
    (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = iVar9._M_current + 1;
  }
  else {
    pVVar1 = (this->input_vertices_).
             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar10 = (this->edge_sites_).
              super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_80 = &pcVar10[lVar12].super_compact_array_base<int,_std::allocator<int>_>.field_7;
    paVar15 = local_80;
    if (pcVar10[lVar12].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
      paVar15 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                pcVar10[lVar12].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_
      ;
    }
    a1 = pVVar1 + ppVar16->second;
    uVar8 = *(uint *)&pcVar10[lVar12].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff
    ;
    lVar13 = lVar12 * 0x10;
    local_68 = ppVar16;
    if (uVar8 != 0) {
      local_b0 = pVVar1 + ppVar16->first;
      local_60 = (int *)((long)paVar15 + (ulong)uVar8 * 4);
      local_88 = (vector<int,std::allocator<int>> *)chain;
      local_78 = lVar12 * 0x10;
      local_70 = pcVar10;
      do {
        local_b4 = *(int *)paVar15;
        x = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start + local_b4;
        iVar3 = s2pred::CompareEdgeDistance
                          (x,local_b0,a1,(S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
        if (iVar3 < 1) {
          piVar6 = *(pointer *)((long)chain + 8);
          if (*(pointer *)chain != piVar6) {
            do {
              pVVar1 = (this->sites_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_a8.c_[2] = pVVar1[piVar6[-1]].c_[2];
              pVVar1 = pVVar1 + piVar6[-1];
              local_a8.c_[0] = pVVar1->c_[0];
              local_a8.c_[1] = pVVar1->c_[1];
              S1ChordAngle::S1ChordAngle(&local_50,&local_a8,x);
              if ((this->max_adjacent_site_separation_ca_).length2_ <= local_50.length2_) break;
              EVar4 = s2pred::GetVoronoiSiteExclusion
                                (&local_a8,x,local_b0,a1,
                                 (S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
              if (EVar4 != FIRST) {
                if (EVar4 == SECOND) goto LAB_001aabe6;
                if (EVar4 != NEITHER) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)&local_48,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                             ,0x3ee,kFatal,(ostream *)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_48.c_[1],
                             "Check failed: (s2pred::Excluded::NEITHER) == (result) ",0x36);
                  goto LAB_001aae7c;
                }
                if ((ulong)((long)*(pointer *)((long)chain + 8) - *(long *)chain) < 5) break;
                iVar3 = (*(pointer *)((long)chain + 8))[-2];
                pVVar1 = (this->sites_).
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                local_48.c_[2] = pVVar1[iVar3].c_[2];
                pVVar1 = pVVar1 + iVar3;
                local_48.c_[0] = pVVar1->c_[0];
                local_48.c_[1] = pVVar1->c_[1];
                S1ChordAngle::S1ChordAngle(&local_58,&local_48,x);
                x0 = local_b0;
                chain = (vector<int,_std::allocator<int>_> *)local_88;
                if ((this->max_adjacent_site_separation_ca_).length2_ <= local_58.length2_) break;
                iVar3 = s2pred::Sign(local_b0,a1,&local_a8);
                iVar5 = s2pred::Sign(&local_48,&local_a8,x);
                chain = (vector<int,_std::allocator<int>_> *)local_88;
                if ((iVar5 == iVar3) ||
                   (iVar5 = s2pred::EdgeCircumcenterSign(x0,a1,&local_48,&local_a8,x),
                   chain = (vector<int,_std::allocator<int>_> *)local_88, iVar5 != iVar3)) break;
              }
              piVar6 = *(pointer *)((long)chain + 8) + -1;
              *(pointer *)((long)chain + 8) = piVar6;
            } while (*(pointer *)chain != piVar6);
          }
          iVar9._M_current = *(int **)((long)chain + 8);
          if (iVar9._M_current == *(int **)((long)chain + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)chain,iVar9,&local_b4);
          }
          else {
            *iVar9._M_current = local_b4;
            *(int **)((long)chain + 8) = iVar9._M_current + 1;
          }
        }
LAB_001aabe6:
        paVar15 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                  ((long)paVar15 + 4);
      } while (paVar15 !=
               (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
               local_60);
      piVar6 = *(pointer *)chain;
      iVar9._M_current = *(int **)((long)chain + 8);
      pcVar10 = local_70;
      lVar13 = local_78;
    }
    if (piVar6 == iVar9._M_current) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x409,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a8.c_[1],"Check failed: !chain->empty() ",0x1e);
LAB_001aae7c:
      abort();
    }
    pcVar11 = (pcVar10->super_compact_array_base<int,_std::allocator<int>_>).unused_padding_ +
              lVar13 + -5;
    if ((char)*(uint *)(pcVar11 + 4) == '\0') {
      local_80 = *(anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 **)
                  (pcVar11 + 8);
    }
    uVar8 = *(uint *)pcVar11;
    if ((uVar8 & 0xffffff) != 0) {
      uVar17 = 0;
      do {
        pVVar1 = (this->sites_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = s2pred::CompareDistances
                          (a1,pVVar1 + (*(pointer *)((long)chain + 8))[-1],
                           pVVar1 + *(int *)((long)local_80 + uVar17));
        if (0 < iVar3) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                     ,0x40e,kError,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a8.c_[1],"Snapping invariant broken!",0x1a);
          S2LogMessage::~S2LogMessage((S2LogMessage *)&local_a8);
        }
        uVar17 = uVar17 + 4;
      } while ((uVar8 & 0xffffff) << 2 != uVar17);
    }
    if (s2builder_verbose != false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      ppVar16 = local_68;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_68->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,ppVar16->second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): ",3);
      piVar2 = *(int **)((long)chain + 8);
      for (piVar14 = *(int **)chain; piVar14 != piVar2; piVar14 = piVar14 + 1) {
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void S2Builder::SnapEdge(InputEdgeId e, vector<SiteId>* chain) const {
  chain->clear();
  const InputEdge& edge = input_edges_[e];
  if (!snapping_needed_) {
    chain->push_back(edge.first);
    chain->push_back(edge.second);
    return;
  }

  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];

  // Optimization: if there is only one nearby site, return.
  // Optimization: if there are exactly two nearby sites, and one is close
  // enough to each vertex, then return.

  // Now iterate through the sites.  We keep track of the sequence of sites
  // that are visited.
  const auto& candidates = edge_sites_[e];
  for (SiteId site_id : candidates) {
    const S2Point& c = sites_[site_id];
    // Skip any sites that are too far away.  (There will be some of these,
    // because we also keep track of "sites to avoid".)  Note that some sites
    // may be close enough to the line containing the edge, but not to the
    // edge itself, so we can just use the dot product with the edge normal.
    if (s2pred::CompareEdgeDistance(c, x, y, edge_snap_radius_ca_) > 0) {
      continue;
    }
    // Check whether the new site C excludes the previous site B.  If so,
    // repeat with the previous site, and so on.
    bool add_site_c = true;
    for (; !chain->empty(); chain->pop_back()) {
      S2Point b = sites_[chain->back()];

      // First, check whether B and C are so far apart that their clipped
      // Voronoi regions can't intersect.
      S1ChordAngle bc(b, c);
      if (bc >= max_adjacent_site_separation_ca_) break;

      // Otherwise, we want to check whether site C prevents the Voronoi
      // region of B from intersecting XY, or vice versa.  This can be
      // determined by computing the "coverage interval" (the segment of XY
      // intersected by the coverage disc of radius snap_radius) for each
      // site.  If the coverage interval of one site contains the coverage
      // interval of the other, then the contained site can be excluded.
      s2pred::Excluded result = s2pred::GetVoronoiSiteExclusion(
          b, c, x, y, edge_snap_radius_ca_);
      if (result == s2pred::Excluded::FIRST) continue;  // Site B excluded by C
      if (result == s2pred::Excluded::SECOND) {
        add_site_c = false;  // Site C is excluded by B.
        break;
      }
      S2_DCHECK_EQ(s2pred::Excluded::NEITHER, result);

      // Otherwise check whether the previous site A is close enough to B and
      // C that it might further clip the Voronoi region of B.
      if (chain->size() < 2) break;
      S2Point a = sites_[chain->end()[-2]];
      S1ChordAngle ac(a, c);
      if (ac >= max_adjacent_site_separation_ca_) break;

      // If triangles ABC and XYB have the same orientation, the circumcenter
      // Z of ABC is guaranteed to be on the same side of XY as B.
      int xyb = s2pred::Sign(x, y, b);
      if (s2pred::Sign(a, b, c) == xyb) {
        break;  // The circumcenter is on the same side as B but further away.
      }
      // Other possible optimizations:
      //  - if AB > max_adjacent_site_separation_ca_ then keep B.
      //  - if d(B, XY) < 0.5 * min(AB, BC) then keep B.

      // If the circumcenter of ABC is on the same side of XY as B, then B is
      // excluded by A and C combined.  Otherwise B is needed and we can exit.
      if (s2pred::EdgeCircumcenterSign(x, y, a, b, c) != xyb) break;
    }
    if (add_site_c) {
      chain->push_back(site_id);
    }
  }
  S2_DCHECK(!chain->empty());
  if (google::DEBUG_MODE) {
    for (SiteId site_id : candidates) {
      if (s2pred::CompareDistances(y, sites_[chain->back()],
                                   sites_[site_id]) > 0) {
        S2_LOG(ERROR) << "Snapping invariant broken!";
      }
    }
  }
  if (s2builder_verbose) {
    std::cout << "(" << edge.first << "," << edge.second << "): ";
    for (SiteId id : *chain) std::cout << id << " ";
    std::cout << std::endl;
  }
}